

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.cpp
# Opt level: O3

bool __thiscall axl::xml::ExpatParserRoot::create(ExpatParserRoot *this,StringRef *encoding)

{
  bool bVar1;
  C *pCVar2;
  XML_ParserStruct *pXVar3;
  
  if ((this->
      super_Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>
      ).m_h != (XML_ParserStruct *)0x0) {
    XML_ParserFree();
    (this->
    super_Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>)
    .m_h = (XML_ParserStruct *)0x0;
  }
  if (encoding->m_length == 0) {
    pCVar2 = (C *)0x0;
  }
  else {
    pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       (encoding);
  }
  pXVar3 = (XML_ParserStruct *)XML_ParserCreate(pCVar2);
  (this->
  super_Handle<XML_ParserStruct_*,_axl::xml::FreeExpatParser,_axl::sl::Zero<XML_ParserStruct_*>_>).
  m_h = pXVar3;
  bVar1 = err::completeWithSystemError<bool>(pXVar3 != (XML_ParserStruct *)0x0,false,0xc);
  return bVar1;
}

Assistant:

bool
ExpatParserRoot::create(const sl::StringRef& encoding) {
	close();

	m_h = XML_ParserCreate(encoding.szn());
	return err::completeWithSystemError(m_h != NULL, false, err::SystemErrorCode_InsufficientResources);
}